

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cc
# Opt level: O2

void __thiscall test_apply_endian_swap::test_method(test_apply_endian_swap *this)

{
  int i;
  PluginManager *pPVar1;
  long *plVar2;
  long lVar3;
  undefined1 *puVar4;
  reference_wrapper<const_Typelib::Type> rVar5;
  reference_wrapper<const_Typelib::Type> rVar6;
  int iVar7;
  int i_1;
  float *pfVar8;
  int j;
  long lVar9;
  int j_1;
  int i_2;
  float (*pafVar10) [20];
  float fVar11;
  Value in;
  Value out;
  float local_d90;
  self manager;
  undefined **local_d80;
  undefined1 local_d78;
  undefined8 *local_d70;
  char *local_d68;
  long local_d60;
  float (*local_d58) [20];
  CompileEndianSwapVisitor compiled;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  undefined1 *local_ce8;
  undefined1 *local_ce0;
  char *local_cd8;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  undefined1 *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  undefined1 *local_c88;
  undefined1 *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  undefined1 *local_c58;
  undefined1 *local_c50;
  char *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  undefined1 *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  Registry registry;
  config_set config;
  B swapped_b;
  undefined **local_560;
  uint local_558;
  undefined1 local_554;
  undefined2 local_552;
  undefined8 *local_550;
  char *local_548;
  undefined4 local_3c0;
  undefined1 local_360 [816];
  
  Typelib::Registry::Registry(&registry);
  utilmm::singleton::wrapper<Typelib::PluginManager>::attach();
  pPVar1 = utilmm::singleton::wrapper<Typelib::PluginManager>::instance();
  std::__cxx11::string::string((string *)&local_560,"tlb",(allocator *)&swapped_b);
  plVar2 = (long *)Typelib::PluginManager::importer((string *)pPVar1);
  std::__cxx11::string::~string((string *)&local_560);
  utilmm::config_set::config_set(&config,(config_set *)0x0);
  std::__cxx11::string::string
            ((string *)&local_560,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_cimport.tlb"
             ,(allocator *)&swapped_b);
  (**(code **)(*plVar2 + 0x18))(plVar2,&local_560,&config,&registry);
  std::__cxx11::string::~string((string *)&local_560);
  local_b88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b88,0xf4);
  swapped_b.a.a._0_1_ = 1;
  swapped_b.a.b = 0;
  swapped_b.a.c = '\0';
  swapped_b.a._13_1_ = 0;
  swapped_b.a.d = 0;
  swapped_b.c[0] = 0.0;
  swapped_b.c[1] = 0.0;
  local_558 = local_558 & 0xffffff00;
  local_560 = &PTR__lazy_ostream_0017a2e0;
  local_550 = &boost::unit_test::lazy_ostream::inst;
  local_548 = 
  "no exceptions thrown by importer->load(\"/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/\" \"test_cimport.tlb\", config, registry)"
  ;
  local_ba8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_ba0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)swapped_b.c);
  local_560 = (undefined **)0xa00000000000000;
  local_558 = 0x14000000;
  local_554 = 0x62;
  local_552 = 0x3400;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    fVar11 = (float)(int)lVar3 / 10.0;
    *(uint *)((long)&local_550 + lVar3 * 4) =
         (uint)fVar11 >> 0x18 | ((uint)fVar11 & 0xff0000) >> 8 | ((uint)fVar11 & 0xff00) << 8 |
         (int)fVar11 << 0x18;
  }
  puVar4 = local_360;
  local_3c0 = 0x2842;
  iVar7 = 0;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
      fVar11 = (float)(iVar7 + (int)lVar9);
      *(uint *)(puVar4 + lVar9 * 4) =
           (uint)fVar11 >> 0x18 | ((uint)fVar11 & 0xff0000) >> 8 | ((uint)fVar11 & 0xff00) << 8 |
           (int)fVar11 << 0x18;
    }
    puVar4 = puVar4 + 0x50;
    iVar7 = iVar7 + 100;
  }
  std::__cxx11::string::string((string *)&swapped_b,"/B",(allocator *)&compiled);
  rVar5.t_ = (Type *)Typelib::Registry::get((string *)&registry);
  std::__cxx11::string::~string((string *)&swapped_b);
  std::__cxx11::string::string((string *)&compiled,"/B",(allocator *)&local_d80);
  rVar6.t_ = (Type *)Typelib::Registry::get((string *)&registry);
  std::__cxx11::string::~string((string *)&compiled);
  _compiled = boost::test_tools::tt_detail::report_assertion;
  Typelib::CompileEndianSwapVisitor::apply((Type *)&compiled);
  in.m_type.t_ = rVar5.t_;
  in.m_data = &local_560;
  out.m_type.t_ = rVar6.t_;
  out.m_data = &swapped_b;
  Typelib::CompileEndianSwapVisitor::swap(&compiled,in,out);
  local_be8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_be0 = "";
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_be8,0x10f);
  local_d78 = 0;
  local_d80 = &PTR__lazy_ostream_00179358;
  local_d70 = &boost::unit_test::lazy_ostream::inst;
  local_d68 = "";
  local_c08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c00 = "";
  local_d90 = 1.4013e-44;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,long_long>
            (&local_d80,&local_c08,0x10f,2,2,&local_d90,"10",&swapped_b,"swapped_b.a.a");
  local_c18 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c10 = "";
  local_c28 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c18,0x110);
  local_d78 = 0;
  local_d80 = &PTR__lazy_ostream_00179358;
  local_d70 = &boost::unit_test::lazy_ostream::inst;
  local_d68 = "";
  local_c38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c30 = "";
  local_d90 = 2.8026e-44;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_d80,&local_c38,0x110,2,2,&local_d90,"20",&swapped_b.a.b,"swapped_b.a.b");
  local_c48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c40 = "";
  local_c58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c48,0x111);
  local_d78 = 0;
  local_d80 = &PTR__lazy_ostream_00179358;
  local_d70 = &boost::unit_test::lazy_ostream::inst;
  local_d68 = "";
  local_c68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c60 = "";
  local_d90 = (float)CONCAT31(local_d90._1_3_,0x62);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_d80,&local_c68,0x111,2,2,&local_d90,"\'b\'",&swapped_b.a.c,"swapped_b.a.c");
  local_c78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c70 = "";
  local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c78,0x112);
  local_d78 = 0;
  local_d80 = &PTR__lazy_ostream_00179358;
  local_d70 = &boost::unit_test::lazy_ostream::inst;
  local_d68 = "";
  local_c98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_c90 = "";
  local_d90 = 7.28675e-44;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,short>
            (&local_d80,&local_c98,0x112,2,2,&local_d90,"52",&swapped_b.a.d,"swapped_b.a.d");
  pfVar8 = swapped_b.c;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    local_cd8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
    ;
    local_cd0 = "";
    local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ce0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_cd8,0x114,&local_ce8);
    local_d78 = 0;
    local_d80 = &PTR__lazy_ostream_00179358;
    local_d70 = &boost::unit_test::lazy_ostream::inst;
    local_d68 = "";
    local_cf8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
    ;
    local_cf0 = "";
    local_d90 = (float)(int)lVar3 / 10.0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
              (&local_d80,&local_cf8,0x114,2,2,&local_d90,"static_cast<float>(i) / 10.0f",pfVar8,
               "swapped_b.c[i]");
    pfVar8 = pfVar8 + 1;
  }
  local_ca8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_ca0 = "";
  local_cb8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_ca8,0x115);
  local_d78 = 0;
  local_d80 = &PTR__lazy_ostream_00179358;
  local_d70 = &boost::unit_test::lazy_ostream::inst;
  local_d68 = "";
  local_cc8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
  ;
  local_cc0 = "";
  local_d90 = 5.88545e-44;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,float>
            (&local_d80,&local_cc8,0x115,2,2,&local_d90,"42",swapped_b.d,"swapped_b.d[0]");
  pafVar10 = swapped_b.i;
  iVar7 = 0;
  lVar3 = 0;
  while (lVar3 != 10) {
    local_d60 = lVar3;
    local_d58 = pafVar10;
    for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
      local_d08 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
      ;
      local_d00 = "";
      local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d08,0x118,&local_d18)
      ;
      local_d78 = 0;
      local_d80 = &PTR__lazy_ostream_00179358;
      local_d70 = &boost::unit_test::lazy_ostream::inst;
      local_d68 = "";
      local_d28 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/orocos-toolchain[P]typelib/test/test_value.cc"
      ;
      local_d20 = "";
      local_d90 = (float)(iVar7 + (int)lVar9);
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,float>
                (&local_d80,&local_d28,0x118,2,2,&local_d90,"i * 100 + j",pafVar10,
                 "swapped_b.i[i][j]");
      pafVar10 = (float (*) [20])(*pafVar10 + 1);
    }
    pafVar10 = local_d58 + 1;
    iVar7 = iVar7 + 100;
    lVar3 = local_d60 + 1;
  }
  Typelib::CompileEndianSwapVisitor::~CompileEndianSwapVisitor(&compiled);
  utilmm::config_set::~config_set(&config);
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  utilmm::singleton::use<Typelib::PluginManager>::~use(&manager);
  Typelib::Registry::~Registry(&registry);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_apply_endian_swap )
{
    // Get the test file into repository
    Registry registry;
    PluginManager::self manager;
    unique_ptr<Importer> importer(manager->importer("tlb"));
    utilmm::config_set config;
    BOOST_REQUIRE_NO_THROW( importer->load(TEST_DATA_PATH("test_cimport.tlb"), config, registry) );

    A a = {
        Endian::swap((long long)10),
        Endian::swap((int)20),
        Endian::swap('b'),
        Endian::swap((short)52)
    };
    B b;
    b.a = a;
    for (int i = 0; i < 10; ++i)
        b.c[i] = Endian::swap(static_cast<float>(i) / 10.0f);

    b.d[0] = Endian::swap<float>(42);

    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            b.i[i][j] = Endian::swap<float>(i * 100 + j);

    Value v_b(&b, *registry.get("/B"));
    B swapped_b;
    Value v_swapped_b(&swapped_b, *registry.get("/B"));

    CompileEndianSwapVisitor compiled;
    compiled.apply(v_b.getType());
    compiled.swap(v_b, v_swapped_b);

    BOOST_REQUIRE_EQUAL(10, swapped_b.a.a);
    BOOST_REQUIRE_EQUAL(20, swapped_b.a.b);
    BOOST_REQUIRE_EQUAL('b', swapped_b.a.c);
    BOOST_REQUIRE_EQUAL(52, swapped_b.a.d);
    for (int i = 0; i < 10; ++i)
        BOOST_REQUIRE_EQUAL(static_cast<float>(i) / 10.0f, swapped_b.c[i]);
    BOOST_REQUIRE_EQUAL(42, swapped_b.d[0]);
    for (int i = 0; i < 10; ++i)
        for (int j = 0; j < 10; ++j)
            BOOST_REQUIRE_EQUAL(i * 100 + j, swapped_b.i[i][j]);
}